

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 target,U32 mls,int extDict)

{
  ulong *puVar1;
  U32 UVar2;
  BYTE *pBVar3;
  U32 *pUVar4;
  bool bVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  char cVar9;
  uint *puVar10;
  int iVar11;
  ulong *puVar12;
  uint uVar13;
  uint uVar14;
  ulong *puVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  U32 UVar19;
  BYTE *pBVar20;
  uint uVar21;
  uint uVar22;
  U32 dummy32;
  BYTE *pInLoopLimit;
  uint local_c8;
  uint *local_b8;
  uint *local_b0;
  ulong local_a0;
  ulong local_98;
  uint local_8c;
  BYTE *local_88;
  ulong local_80;
  ulong *local_78;
  BYTE *local_70;
  BYTE *local_68;
  ulong *local_60;
  ulong *local_58;
  BYTE *local_50;
  U32 *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar13 = (ms->cParams).hashLog;
  if (0x20 < uVar13) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  cVar9 = (char)uVar13;
  switch(mls) {
  case 5:
    lVar16 = -0x30e4432345000000;
    break;
  case 6:
    lVar16 = -0x30e4432340650000;
    break;
  case 7:
    lVar16 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar16 = -0x30e44323485a9b9d;
    break;
  default:
    uVar17 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar9 & 0x1fU));
    goto LAB_007c3958;
  }
  uVar17 = (ulong)(lVar16 * *(long *)ip) >> (-cVar9 & 0x3fU);
LAB_007c3958:
  uVar21 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  pBVar3 = (ms->window).base;
  uVar22 = (int)ip - (int)pBVar3;
  uVar13 = uVar22 - uVar21;
  if (uVar22 < uVar21) {
    uVar13 = 0;
  }
  uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar2 = (ms->window).lowLimit;
  UVar19 = target - uVar14;
  if (target - UVar2 <= uVar14) {
    UVar19 = UVar2;
  }
  if (ms->loadedDictEnd != 0) {
    UVar19 = UVar2;
  }
  iVar11 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (target < uVar22) {
    __assert_fail("curr <= target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x1dc,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x1dd,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  pUVar4 = ms->chainTable;
  uVar14 = ms->hashTable[uVar17];
  uVar18 = (ulong)uVar14;
  local_88 = (ms->window).dictBase;
  uVar7 = (ulong)(ms->window).dictLimit;
  ms->hashTable[uVar17] = uVar22;
  if (UVar19 == 0) {
    __assert_fail("windowLow > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x1e0,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  uVar17 = (ulong)((uVar22 & uVar21) * 2);
  local_b0 = pUVar4 + uVar17;
  local_b8 = pUVar4 + uVar17 + 1;
  local_c8 = uVar22 + 9;
  uVar17 = 8;
  if (UVar19 <= uVar14) {
    local_68 = local_88 + uVar7;
    local_70 = pBVar3 + uVar7;
    local_78 = (ulong *)(iend + -7);
    local_58 = (ulong *)(iend + -3);
    local_60 = (ulong *)(iend + -1);
    local_98 = 0;
    local_a0 = 0;
    local_80 = uVar7;
    local_48 = pUVar4;
    do {
      uVar7 = local_a0;
      if (local_98 < local_a0) {
        uVar7 = local_98;
      }
      local_38 = uVar17;
      if (uVar22 <= (uint)uVar18) {
        __assert_fail("matchIndex < curr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x1e4,
                      "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                     );
      }
      uVar17 = uVar18 & 0xffffffff;
      local_40 = uVar18;
      if ((extDict == 0) || (local_80 <= uVar17 + uVar7)) {
        if (uVar17 + uVar7 < local_80) {
          __assert_fail("matchIndex+matchLength >= dictLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x1fc,
                        "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                       );
        }
        puVar1 = (ulong *)(ip + uVar7);
        puVar12 = (ulong *)(pBVar3 + uVar17 + uVar7);
        puVar15 = puVar1;
        if (puVar1 < local_78) {
          uVar8 = *puVar1 ^ *puVar12;
          uVar18 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
            }
          }
          uVar18 = uVar18 >> 3 & 0x1fffffff;
          if (*puVar12 == *puVar1) {
            do {
              puVar15 = puVar15 + 1;
              puVar12 = puVar12 + 1;
              if (local_78 <= puVar15) goto LAB_007c3c0b;
              uVar8 = *puVar15 ^ *puVar12;
              uVar18 = 0;
              if (uVar8 != 0) {
                for (; (uVar8 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar18 = (long)puVar15 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar1);
            } while (*puVar12 == *puVar15);
          }
        }
        else {
LAB_007c3c0b:
          if ((puVar15 < local_58) && ((int)*puVar12 == (int)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 4);
            puVar12 = (ulong *)((long)puVar12 + 4);
          }
          if ((puVar15 < local_60) && ((short)*puVar12 == (short)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 2);
            puVar12 = (ulong *)((long)puVar12 + 2);
          }
          if (puVar15 < iend) {
            puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar12 == (char)*puVar15));
          }
          uVar18 = (long)puVar15 - (long)puVar1;
        }
        uVar7 = uVar18 + uVar7;
        pBVar20 = pBVar3 + uVar17;
      }
      else {
        local_50 = local_88 + uVar17;
        sVar6 = ZSTD_count_2segments(ip + uVar7,local_50 + uVar7,iend,local_68,local_70);
        uVar7 = sVar6 + uVar7;
        pBVar20 = pBVar3 + uVar17;
        if (uVar7 + uVar17 < local_80) {
          pBVar20 = local_50;
        }
      }
      uVar18 = local_40;
      uVar14 = (uint)local_40;
      uVar17 = local_38;
      if ((local_38 < uVar7) && (uVar17 = uVar7, local_c8 - uVar14 < uVar7)) {
        local_c8 = uVar14 + (int)uVar7;
      }
      if (ip + uVar7 == iend) {
        bVar5 = false;
      }
      else {
        puVar10 = local_48 + (uVar14 & uVar21) * 2;
        if (pBVar20[uVar7] < ip[uVar7]) {
          *local_b0 = uVar14;
          local_98 = uVar7;
          if (uVar13 < uVar14) {
            puVar10 = puVar10 + 1;
            local_b0 = puVar10;
LAB_007c3cfc:
            uVar18 = (ulong)*puVar10;
            bVar5 = true;
          }
          else {
            bVar5 = false;
            local_b0 = &local_8c;
          }
        }
        else {
          *local_b8 = uVar14;
          local_b8 = puVar10;
          local_a0 = uVar7;
          if (uVar13 < uVar14) goto LAB_007c3cfc;
          bVar5 = false;
          local_b8 = &local_8c;
        }
      }
    } while (((bVar5) && (iVar11 = iVar11 + -1, iVar11 != 0)) && (UVar19 <= (uint)uVar18));
  }
  *local_b8 = 0;
  *local_b0 = 0;
  uVar13 = local_c8 - (uVar22 + 8);
  if (uVar22 + 8 <= local_c8 && uVar13 != 0) {
    uVar22 = (int)uVar17 - 0x180;
    uVar21 = 0xc0;
    if (uVar22 < 0xc0) {
      uVar21 = uVar22;
    }
    uVar22 = 0;
    if (0x180 < uVar17) {
      uVar22 = uVar21;
    }
    if (uVar22 <= uVar13) {
      uVar22 = uVar13;
    }
    return uVar22;
  }
  __assert_fail("matchEndIdx > curr + 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                ,0x223,
                "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
               );
}

Assistant:

static U32 ZSTD_insertBt1(
                const ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const target,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 curr = (U32)(ip-base);
    const U32 btLow = btMask >= curr ? 0 : curr - btMask;
    U32* smallerPtr = bt + 2*(curr&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    /* windowLow is based on target because
     * we only need positions that will be in the window at the end of the tree update.
     */
    U32 const windowLow = ZSTD_getLowestMatchIndex(ms, target, cParams->windowLog);
    U32 matchEndIdx = curr+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((curr-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((curr-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", curr);

    assert(curr <= target);
    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = curr;   /* Update Hash Table */

    assert(windowLow > 0);
    for (; nbCompares && (matchIndex >= windowLow); --nbCompares) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < curr);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    {   U32 positions = 0;
        if (bestLength > 384) positions = MIN(192, (U32)(bestLength - 384));   /* speed optimization */
        assert(matchEndIdx > curr + 8);
        return MAX(positions, matchEndIdx - (curr + 8));
    }
}